

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<c___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5,ArrayPtr<const_char> *params_6,
          ArrayPtr<const_char> *params_7,CappedArray<char,_14UL> *params_8,
          ArrayPtr<const_char> *params_9,StringTree *params_10,ArrayPtr<const_char> *params_11,
          ArrayPtr<const_char> *params_12,ArrayPtr<const_char> *params_13,
          ArrayPtr<const_char> *params_14,ArrayPtr<const_char> *params_15,
          ArrayPtr<const_char> *params_16,ArrayPtr<const_char> *params_17,
          CappedArray<char,_14UL> *params_18,ArrayPtr<const_char> *params_19,StringTree *params_20,
          StringTree *params_21,ArrayPtr<const_char> *params_22,String *params_23,
          ArrayPtr<const_char> *params_24,ArrayPtr<const_char> *params_25,
          ArrayPtr<const_char> *params_26,ArrayPtr<const_char> *params_27,
          ArrayPtr<const_char> *params_28,ArrayPtr<const_char> *params_29,
          ArrayPtr<const_char> *params_30,String *params_31,ArrayPtr<const_char> *params_32,
          CappedArray<char,_14UL> *params_33,ArrayPtr<const_char> *params_34,
          ArrayPtr<const_char> *params_35,ArrayPtr<const_char> *params_36,StringTree *params_37,
          ArrayPtr<const_char> *params_38,String *params_39,ArrayPtr<const_char> *params_40,
          ArrayPtr<const_char> *params_41,ArrayPtr<const_char> *params_42,
          ArrayPtr<const_char> *params_43,ArrayPtr<const_char> *params_44,
          ArrayPtr<const_char> *params_45,ArrayPtr<const_char> *params_46,String *params_47,
          ArrayPtr<const_char> *params_48,CappedArray<char,_14UL> *params_49,
          ArrayPtr<const_char> *params_50,ArrayPtr<const_char> *params_51,
          ArrayPtr<const_char> *params_52,StringTree *params_53,StringTree *params_54,
          ArrayPtr<const_char> *params_55,ArrayPtr<const_char> *params_56,
          ArrayPtr<const_char> *params_57,ArrayPtr<const_char> *params_58,
          ArrayPtr<const_char> *params_59,String *params_60,ArrayPtr<const_char> *params_61,
          ArrayPtr<const_char> *params_62,ArrayPtr<const_char> *params_63,String *params_64,
          ArrayPtr<const_char> *params_65)

{
  size_t sVar1;
  StringTree *pSVar2;
  ArrayPtr<const_char> *pAVar3;
  CappedArray<char,_14UL> *pCVar4;
  String *pSVar5;
  ArrayPtr<const_char> *pAVar6;
  ArrayPtr<const_char> *pAVar7;
  ArrayPtr<const_char> *pAVar8;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  CappedArray<char,_14UL> *in_stack_000001f8;
  ArrayPtr<const_char> *in_stack_00000200;
  StringTree *in_stack_00000208;
  StringTree *in_stack_00000210;
  StringTree *in_stack_00000218;
  StringTree *in_stack_00000220;
  ArrayPtr<const_char> *in_stack_00000228;
  ArrayPtr<const_char> *in_stack_00000230;
  ArrayPtr<const_char> *in_stack_00000238;
  ArrayPtr<const_char> *in_stack_00000240;
  ArrayPtr<const_char> *in_stack_00000248;
  String *in_stack_00000250;
  ArrayPtr<const_char> *in_stack_00000258;
  ArrayPtr<const_char> *in_stack_00000260;
  ArrayPtr<const_char> *in_stack_00000268;
  String *in_stack_00000270;
  ArrayPtr<const_char> *in_stack_00000278;
  CappedArray<char,_14UL> *in_stack_00000280;
  ArrayPtr<const_char> *in_stack_00000288;
  StringTree *in_stack_00000290;
  StringTree *in_stack_00000298;
  ArrayPtr<const_char> *in_stack_000002a0;
  String *in_stack_000002a8;
  ArrayPtr<const_char> *in_stack_000002b0;
  ArrayPtr<const_char> *in_stack_000002b8;
  ArrayPtr<const_char> *in_stack_000002c0;
  ArrayPtr<const_char> *in_stack_000002c8;
  ArrayPtr<const_char> *in_stack_000002d0;
  ArrayPtr<const_char> *in_stack_000002d8;
  ArrayPtr<const_char> *in_stack_000002e0;
  String *in_stack_000002e8;
  ArrayPtr<const_char> *in_stack_000002f0;
  CappedArray<char,_14UL> *in_stack_000002f8;
  ArrayPtr<const_char> *in_stack_00000300;
  StringTree *in_stack_00000308;
  StringTree *in_stack_00000310;
  ArrayPtr<const_char> *in_stack_00000318;
  ArrayPtr<const_char> *local_11e8;
  ArrayPtr<const_char> *local_11e0;
  ArrayPtr<const_char> *local_11d8;
  ArrayPtr<const_char> *local_11d0;
  ArrayPtr<const_char> *local_11c8;
  ArrayPtr<const_char> *local_11c0;
  CappedArray<char,_14UL> *local_11b8;
  ArrayPtr<const_char> *local_11b0;
  StringTree *local_11a8;
  ArrayPtr<const_char> *local_11a0;
  ArrayPtr<const_char> *local_1198;
  ArrayPtr<const_char> *local_1190;
  ArrayPtr<const_char> *local_1188;
  ArrayPtr<const_char> *local_1180;
  ArrayPtr<const_char> *local_1178;
  ArrayPtr<const_char> *local_1170;
  CappedArray<char,_14UL> *local_1168;
  ArrayPtr<const_char> *local_1160;
  StringTree *local_1158;
  StringTree *local_1150;
  ArrayPtr<const_char> *local_1148;
  String *local_1140;
  ArrayPtr<const_char> *local_1138;
  ArrayPtr<const_char> *local_1130;
  ArrayPtr<const_char> *local_1128;
  ArrayPtr<const_char> *local_1120;
  ArrayPtr<const_char> *local_1118;
  ArrayPtr<const_char> *local_1110;
  ArrayPtr<const_char> *local_1108;
  String *local_1100;
  ArrayPtr<const_char> *local_10f8;
  CappedArray<char,_14UL> *local_10f0;
  ArrayPtr<const_char> *local_10e8;
  ArrayPtr<const_char> *local_10e0;
  ArrayPtr<const_char> *local_10d8;
  StringTree *local_10d0;
  ArrayPtr<const_char> *local_10c8;
  String *local_10c0;
  ArrayPtr<const_char> *local_10b8;
  ArrayPtr<const_char> *local_10b0;
  ArrayPtr<const_char> *local_10a8;
  ArrayPtr<const_char> *local_10a0;
  ArrayPtr<const_char> *local_1098;
  ArrayPtr<const_char> *local_1090;
  ArrayPtr<const_char> *local_1088;
  String *local_1080;
  ArrayPtr<const_char> *local_1078;
  CappedArray<char,_14UL> *local_1070;
  ArrayPtr<const_char> *local_1068;
  ArrayPtr<const_char> *local_1060;
  ArrayPtr<const_char> *local_1058;
  StringTree *local_1050;
  StringTree *local_1048;
  ArrayPtr<const_char> *local_1040;
  ArrayPtr<const_char> *local_1038;
  ArrayPtr<const_char> *local_1030;
  ArrayPtr<const_char> *local_1028;
  ArrayPtr<const_char> *local_1020;
  String *local_1018;
  ArrayPtr<const_char> *local_1010;
  ArrayPtr<const_char> *local_1008;
  ArrayPtr<const_char> *local_1000;
  String *local_ff8;
  ArrayPtr<const_char> *local_ff0;
  CappedArray<char,_14UL> *local_fe8;
  ArrayPtr<const_char> *local_fe0;
  StringTree *local_fd8;
  StringTree *local_fd0;
  StringTree *local_fc8;
  StringTree *local_fc0;
  ArrayPtr<const_char> *local_fb8;
  ArrayPtr<const_char> *local_fb0;
  ArrayPtr<const_char> *local_fa8;
  ArrayPtr<const_char> *local_fa0;
  ArrayPtr<const_char> *local_f98;
  String *local_f90;
  ArrayPtr<const_char> *local_f88;
  ArrayPtr<const_char> *local_f80;
  ArrayPtr<const_char> *local_f78;
  String *local_f70;
  ArrayPtr<const_char> *local_f68;
  CappedArray<char,_14UL> *local_f60;
  ArrayPtr<const_char> *local_f58;
  StringTree *local_f50;
  StringTree *local_f48;
  ArrayPtr<const_char> *local_f40;
  String *local_f38;
  ArrayPtr<const_char> *local_f30;
  ArrayPtr<const_char> *local_f28;
  ArrayPtr<const_char> *local_f20;
  ArrayPtr<const_char> *local_f18;
  ArrayPtr<const_char> *local_f10;
  ArrayPtr<const_char> *local_f08;
  ArrayPtr<const_char> *local_f00;
  String *local_ef8;
  ArrayPtr<const_char> *local_ef0;
  CappedArray<char,_14UL> *local_ee8;
  ArrayPtr<const_char> *local_ee0;
  StringTree *local_ed8;
  StringTree *local_ed0;
  ArrayPtr<const_char> *local_ec8;
  ArrayPtr<const_char> *local_ec0;
  StringTree *local_eb8;
  ArrayPtr<const_char> *local_eb0;
  ArrayPtr<const_char> *local_ea8;
  ArrayPtr<const_char> *local_ea0;
  StringTree *local_e98;
  ArrayPtr<const_char> *local_e90;
  undefined1 *local_e88;
  StringTree *local_e80;
  StringTree *local_e78;
  ArrayPtr<const_char> *local_e70;
  CappedArray<char,_14UL> *local_e68;
  ArrayPtr<const_char> *local_e60;
  String *local_e58;
  ArrayPtr<const_char> *local_e50;
  ArrayPtr<const_char> *local_e48;
  ArrayPtr<const_char> *local_e40;
  ArrayPtr<const_char> *local_e38;
  ArrayPtr<const_char> *local_e30;
  ArrayPtr<const_char> *local_e28;
  ArrayPtr<const_char> *local_e20;
  String *local_e18;
  ArrayPtr<const_char> *local_e10;
  StringTree *local_e08;
  StringTree *local_e00;
  ArrayPtr<const_char> *local_df8;
  CappedArray<char,_14UL> *local_df0;
  ArrayPtr<const_char> *local_de8;
  String *local_de0;
  ArrayPtr<const_char> *local_dd8;
  ArrayPtr<const_char> *local_dd0;
  ArrayPtr<const_char> *local_dc8;
  String *local_dc0;
  ArrayPtr<const_char> *local_db8;
  ArrayPtr<const_char> *local_db0;
  ArrayPtr<const_char> *local_da8;
  ArrayPtr<const_char> *local_da0;
  ArrayPtr<const_char> *local_d98;
  StringTree *local_d90;
  StringTree *local_d88;
  StringTree *local_d80;
  StringTree *local_d78;
  ArrayPtr<const_char> *local_d70;
  CappedArray<char,_14UL> *local_d68;
  ArrayPtr<const_char> *local_d60;
  String *local_d58;
  ArrayPtr<const_char> *local_d50;
  ArrayPtr<const_char> *local_d48;
  ArrayPtr<const_char> *local_d40;
  String *local_d38;
  ArrayPtr<const_char> *local_d30;
  ArrayPtr<const_char> *local_d28;
  ArrayPtr<const_char> *local_d20;
  ArrayPtr<const_char> *local_d18;
  ArrayPtr<const_char> *local_d10;
  StringTree *local_d08;
  StringTree *local_d00;
  ArrayPtr<const_char> *local_cf8;
  ArrayPtr<const_char> *local_cf0;
  ArrayPtr<const_char> *local_ce8;
  CappedArray<char,_14UL> *local_ce0;
  ArrayPtr<const_char> *local_cd8;
  String *local_cd0;
  ArrayPtr<const_char> *local_cc8;
  ArrayPtr<const_char> *local_cc0;
  ArrayPtr<const_char> *local_cb8;
  ArrayPtr<const_char> *local_cb0;
  ArrayPtr<const_char> *local_ca8;
  ArrayPtr<const_char> *local_ca0;
  ArrayPtr<const_char> *local_c98;
  String *local_c90;
  ArrayPtr<const_char> *local_c88;
  StringTree *local_c80;
  ArrayPtr<const_char> *local_c78;
  ArrayPtr<const_char> *local_c70;
  ArrayPtr<const_char> *local_c68;
  CappedArray<char,_14UL> *local_c60;
  ArrayPtr<const_char> *local_c58;
  String *local_c50;
  ArrayPtr<const_char> *local_c48;
  ArrayPtr<const_char> *local_c40;
  ArrayPtr<const_char> *local_c38;
  ArrayPtr<const_char> *local_c30;
  ArrayPtr<const_char> *local_c28;
  ArrayPtr<const_char> *local_c20;
  ArrayPtr<const_char> *local_c18;
  String *local_c10;
  ArrayPtr<const_char> *local_c08;
  StringTree *local_c00;
  StringTree *local_bf8;
  ArrayPtr<const_char> *local_bf0;
  CappedArray<char,_14UL> *local_be8;
  ArrayPtr<const_char> *local_be0;
  ArrayPtr<const_char> *local_bd8;
  ArrayPtr<const_char> *local_bd0;
  ArrayPtr<const_char> *local_bc8;
  ArrayPtr<const_char> *local_bc0;
  ArrayPtr<const_char> *local_bb8;
  StringTree *local_bb0;
  char *local_ba8;
  size_t *local_ba0;
  size_t local_b98;
  size_t *local_b90;
  size_t local_b88;
  size_t *local_b80;
  size_t local_b78;
  size_t *local_b70;
  size_t local_b68;
  size_t *local_b60;
  size_t local_b58;
  size_t *local_b50;
  size_t local_b48;
  size_t *local_b40;
  size_t local_b38;
  size_t *local_b30;
  size_t local_b28;
  size_t *local_b20;
  size_t local_b18;
  size_t *local_b10;
  size_t local_b08;
  size_t *local_b00;
  size_t local_af8;
  size_t *local_af0;
  size_t local_ae8;
  size_t *local_ae0;
  size_t local_ad8;
  size_t *local_ad0;
  size_t local_ac8;
  size_t *local_ac0;
  size_t local_ab8;
  StringTree *local_ab0;
  StringTree *local_aa8;
  size_t local_aa0;
  size_t local_a98;
  size_t local_a90;
  size_t local_a88;
  size_t local_a80;
  size_t local_a78;
  size_t local_a70;
  size_t local_a68;
  size_t local_a60;
  size_t local_a58;
  size_t local_a50;
  size_t local_a48;
  size_t local_a40;
  size_t local_a38;
  size_t local_a30;
  size_t local_a28;
  size_t local_a20;
  size_t local_a18;
  size_t local_a10;
  size_t local_a08;
  size_t local_a00;
  size_t local_9f8;
  size_t local_9f0;
  size_t local_9e8;
  size_t local_9e0;
  size_t local_9d8;
  size_t local_9d0;
  size_t local_9c8;
  size_t local_9c0;
  size_t local_9b8;
  size_t local_9b0;
  size_t local_9a8;
  size_t local_9a0;
  size_t local_998;
  size_t local_990;
  size_t local_988;
  size_t local_980;
  size_t local_978;
  size_t local_970;
  size_t local_968;
  size_t local_960;
  size_t local_958;
  size_t local_950;
  size_t local_948;
  size_t local_940;
  size_t local_938;
  size_t local_930;
  size_t local_928;
  size_t local_920;
  size_t local_918;
  size_t local_910;
  size_t local_908;
  size_t local_900;
  size_t local_8f8;
  size_t local_8f0;
  size_t local_8e8;
  size_t local_8e0;
  size_t local_8d8;
  size_t local_8d0;
  size_t local_8c8;
  size_t local_8c0;
  size_t local_8b8;
  size_t local_8b0;
  size_t local_8a8;
  size_t local_8a0;
  size_t local_898;
  size_t local_890;
  size_t local_888;
  size_t local_880;
  size_t local_878;
  size_t local_870;
  size_t local_868;
  size_t local_860;
  size_t local_858;
  size_t local_850;
  size_t local_848;
  size_t local_840;
  size_t local_838;
  size_t local_830;
  size_t local_828;
  size_t local_820;
  size_t local_818;
  size_t local_810;
  size_t local_808;
  size_t local_800;
  size_t local_7f8;
  size_t local_7f0;
  size_t local_7e8;
  size_t local_7e0;
  size_t local_7d8;
  size_t local_7d0;
  size_t local_7c8;
  size_t local_7c0;
  size_t local_7b8;
  size_t local_7b0;
  size_t local_7a8;
  size_t local_7a0;
  size_t local_798;
  size_t local_790;
  size_t local_788;
  size_t local_780;
  size_t local_778;
  size_t local_770;
  size_t local_768;
  size_t local_760;
  _ *local_758;
  undefined8 local_750;
  Array<kj::StringTree::Branch> local_748;
  size_t local_730;
  size_t local_728;
  size_t local_720;
  size_t local_718;
  size_t local_710;
  size_t local_708;
  size_t local_700;
  size_t local_6f8;
  size_t local_6f0;
  size_t local_6e8;
  size_t local_6e0;
  size_t local_6d8;
  size_t local_6d0;
  size_t local_6c8;
  size_t local_6c0;
  size_t local_6b8;
  size_t local_6b0;
  size_t local_6a8;
  size_t local_6a0;
  size_t local_698;
  size_t local_690;
  size_t local_688;
  size_t local_680;
  size_t local_678;
  size_t local_670;
  size_t local_668;
  size_t local_660;
  size_t local_658;
  size_t local_650;
  size_t local_648;
  size_t local_640;
  size_t local_638;
  size_t local_630;
  size_t local_628;
  size_t local_620;
  size_t local_618;
  size_t local_610;
  size_t local_608;
  size_t local_600;
  size_t local_5f8;
  size_t local_5f0;
  size_t local_5e8;
  size_t local_5e0;
  size_t local_5d8;
  size_t local_5d0;
  size_t local_5c8;
  size_t local_5c0;
  size_t local_5b8;
  size_t local_5b0;
  size_t local_5a8;
  size_t local_5a0;
  size_t local_598;
  size_t local_590;
  size_t local_588;
  size_t local_580;
  size_t local_578;
  size_t local_570;
  size_t local_568;
  size_t local_560;
  size_t local_558;
  size_t local_550;
  size_t local_548;
  size_t local_540;
  size_t local_538;
  size_t local_530;
  size_t local_528;
  size_t local_520;
  size_t local_518;
  size_t local_510;
  size_t local_508;
  size_t local_500;
  size_t local_4f8;
  size_t local_4f0;
  size_t local_4e8;
  size_t local_4e0;
  size_t local_4d8;
  size_t local_4d0;
  size_t local_4c8;
  size_t local_4c0;
  size_t local_4b8;
  size_t local_4b0;
  size_t local_4a8;
  size_t local_4a0;
  size_t local_498;
  size_t local_490;
  size_t local_488;
  size_t local_480;
  size_t local_478;
  size_t local_470;
  size_t local_468;
  size_t local_460;
  size_t local_458;
  size_t local_450;
  size_t local_448;
  size_t local_440;
  size_t local_438;
  size_t local_430;
  size_t local_428;
  size_t local_420;
  size_t local_418;
  size_t local_410;
  size_t local_408;
  size_t local_400;
  size_t local_3f8;
  _ *local_3f0;
  undefined8 local_3e8;
  String local_3e0;
  size_t local_3b8;
  size_t local_3b0;
  size_t local_3a8;
  size_t local_3a0;
  size_t local_398;
  size_t local_390;
  size_t local_388;
  size_t local_380;
  size_t local_378;
  size_t local_370;
  size_t local_368;
  size_t local_360;
  size_t local_358;
  size_t local_350;
  size_t local_348;
  size_t local_340;
  size_t local_338;
  size_t local_330;
  size_t local_328;
  size_t local_320;
  size_t local_318;
  size_t local_310;
  size_t local_308;
  size_t local_300;
  size_t local_2f8;
  size_t local_2f0;
  size_t local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  size_t local_2a0;
  size_t local_298;
  size_t local_290;
  size_t local_288;
  size_t local_280;
  size_t local_278;
  size_t local_270;
  size_t local_268;
  size_t local_260;
  size_t local_258;
  size_t local_250;
  size_t local_248;
  size_t local_240;
  size_t local_238;
  size_t local_230;
  size_t local_228;
  size_t local_220;
  size_t local_218;
  size_t local_210;
  size_t local_208;
  size_t local_200;
  size_t local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  size_t local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  size_t local_198;
  size_t local_190;
  size_t local_188;
  size_t local_180;
  size_t local_178;
  size_t local_170;
  size_t local_168;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  size_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  size_t local_f0;
  size_t local_e8;
  size_t local_e0;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  _ *local_78;
  undefined8 local_70;
  undefined1 local_61;
  ArrayPtr<const_char> *local_60;
  ArrayPtr<const_char> *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  StringTree *params_local_1;
  StringTree *params_local;
  StringTree *result;
  
  local_61 = 0;
  local_ab0 = __return_storage_ptr__;
  local_aa8 = __return_storage_ptr__;
  local_60 = params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = params;
  params_local_1 = this;
  params_local = __return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_aa0 = size(params_local_1);
  local_ac0 = &local_3b0;
  local_3b8 = local_aa0;
  local_ab8 = size((StringTree *)params_local_2);
  *local_ac0 = local_ab8;
  local_3a8 = ArrayPtr<const_char>::size(params_local_3);
  local_3a0 = ArrayPtr<const_char>::size(params_local_4);
  local_398 = ArrayPtr<const_char>::size(local_60);
  local_390 = ArrayPtr<const_char>::size(params_4);
  local_388 = ArrayPtr<const_char>::size(params_5);
  local_380 = ArrayPtr<const_char>::size(params_6);
  local_378 = ArrayPtr<const_char>::size(params_7);
  local_370 = CappedArray<char,_14UL>::size(params_8);
  local_368 = ArrayPtr<const_char>::size(params_9);
  local_ad0 = &local_360;
  local_ac8 = size(params_10);
  *local_ad0 = local_ac8;
  local_358 = ArrayPtr<const_char>::size(params_11);
  local_350 = ArrayPtr<const_char>::size(params_12);
  local_348 = ArrayPtr<const_char>::size(params_13);
  local_340 = ArrayPtr<const_char>::size(params_14);
  local_338 = ArrayPtr<const_char>::size(params_15);
  local_330 = ArrayPtr<const_char>::size(params_16);
  local_328 = ArrayPtr<const_char>::size(params_17);
  local_320 = CappedArray<char,_14UL>::size(params_18);
  local_318 = ArrayPtr<const_char>::size(params_19);
  local_ae0 = &local_310;
  local_ad8 = size(params_20);
  *local_ae0 = local_ad8;
  local_af0 = &local_308;
  local_ae8 = size(params_21);
  *local_af0 = local_ae8;
  local_300 = ArrayPtr<const_char>::size(params_22);
  local_2f8 = String::size(params_23);
  local_2f0 = ArrayPtr<const_char>::size(params_24);
  local_2e8 = ArrayPtr<const_char>::size(params_25);
  local_2e0 = ArrayPtr<const_char>::size(params_26);
  local_2d8 = ArrayPtr<const_char>::size(params_27);
  local_2d0 = ArrayPtr<const_char>::size(params_28);
  local_2c8 = ArrayPtr<const_char>::size(params_29);
  local_2c0 = ArrayPtr<const_char>::size(params_30);
  local_2b8 = String::size(params_31);
  local_2b0 = ArrayPtr<const_char>::size(params_32);
  local_2a8 = CappedArray<char,_14UL>::size(params_33);
  local_2a0 = ArrayPtr<const_char>::size(params_34);
  local_298 = ArrayPtr<const_char>::size(params_35);
  local_290 = ArrayPtr<const_char>::size(params_36);
  local_b00 = &local_288;
  local_af8 = size(params_37);
  *local_b00 = local_af8;
  local_280 = ArrayPtr<const_char>::size(params_38);
  local_278 = String::size(params_39);
  local_270 = ArrayPtr<const_char>::size(params_40);
  local_268 = ArrayPtr<const_char>::size(params_41);
  local_260 = ArrayPtr<const_char>::size(params_42);
  local_258 = ArrayPtr<const_char>::size(params_43);
  local_250 = ArrayPtr<const_char>::size(params_44);
  local_248 = ArrayPtr<const_char>::size(params_45);
  local_240 = ArrayPtr<const_char>::size(params_46);
  local_238 = String::size(params_47);
  local_230 = ArrayPtr<const_char>::size(params_48);
  local_228 = CappedArray<char,_14UL>::size(params_49);
  local_220 = ArrayPtr<const_char>::size(params_50);
  local_218 = ArrayPtr<const_char>::size(params_51);
  local_210 = ArrayPtr<const_char>::size(params_52);
  local_b10 = &local_208;
  local_b08 = size(params_53);
  *local_b10 = local_b08;
  local_b20 = &local_200;
  local_b18 = size(params_54);
  *local_b20 = local_b18;
  local_1f8 = ArrayPtr<const_char>::size(params_55);
  local_1f0 = ArrayPtr<const_char>::size(params_56);
  local_1e8 = ArrayPtr<const_char>::size(params_57);
  local_1e0 = ArrayPtr<const_char>::size(params_58);
  local_1d8 = ArrayPtr<const_char>::size(params_59);
  local_1d0 = String::size(params_60);
  local_1c8 = ArrayPtr<const_char>::size(params_61);
  local_1c0 = ArrayPtr<const_char>::size(params_62);
  local_1b8 = ArrayPtr<const_char>::size(params_63);
  local_1b0 = String::size(params_64);
  local_1a8 = ArrayPtr<const_char>::size(params_65);
  local_1a0 = CappedArray<char,_14UL>::size(in_stack_000001f8);
  local_198 = ArrayPtr<const_char>::size(in_stack_00000200);
  local_b30 = &local_190;
  local_b28 = size(in_stack_00000208);
  *local_b30 = local_b28;
  local_b40 = &local_188;
  local_b38 = size(in_stack_00000210);
  *local_b40 = local_b38;
  local_b50 = &local_180;
  local_b48 = size(in_stack_00000218);
  *local_b50 = local_b48;
  local_b60 = &local_178;
  local_b58 = size(in_stack_00000220);
  *local_b60 = local_b58;
  local_170 = ArrayPtr<const_char>::size(in_stack_00000228);
  local_168 = ArrayPtr<const_char>::size(in_stack_00000230);
  local_160 = ArrayPtr<const_char>::size(in_stack_00000238);
  local_158 = ArrayPtr<const_char>::size(in_stack_00000240);
  local_150 = ArrayPtr<const_char>::size(in_stack_00000248);
  local_148 = String::size(in_stack_00000250);
  local_140 = ArrayPtr<const_char>::size(in_stack_00000258);
  local_138 = ArrayPtr<const_char>::size(in_stack_00000260);
  local_130 = ArrayPtr<const_char>::size(in_stack_00000268);
  local_128 = String::size(in_stack_00000270);
  local_120 = ArrayPtr<const_char>::size(in_stack_00000278);
  local_118 = CappedArray<char,_14UL>::size(in_stack_00000280);
  local_110 = ArrayPtr<const_char>::size(in_stack_00000288);
  local_b70 = &local_108;
  local_b68 = size(in_stack_00000290);
  *local_b70 = local_b68;
  local_b80 = &local_100;
  local_b78 = size(in_stack_00000298);
  *local_b80 = local_b78;
  local_f8 = ArrayPtr<const_char>::size(in_stack_000002a0);
  local_f0 = String::size(in_stack_000002a8);
  local_e8 = ArrayPtr<const_char>::size(in_stack_000002b0);
  local_e0 = ArrayPtr<const_char>::size(in_stack_000002b8);
  local_d8 = ArrayPtr<const_char>::size(in_stack_000002c0);
  local_d0 = ArrayPtr<const_char>::size(in_stack_000002c8);
  local_c8 = ArrayPtr<const_char>::size(in_stack_000002d0);
  local_c0 = ArrayPtr<const_char>::size(in_stack_000002d8);
  local_b8 = ArrayPtr<const_char>::size(in_stack_000002e0);
  local_b0 = String::size(in_stack_000002e8);
  local_a8 = ArrayPtr<const_char>::size(in_stack_000002f0);
  local_a0 = CappedArray<char,_14UL>::size(in_stack_000002f8);
  local_98 = ArrayPtr<const_char>::size(in_stack_00000300);
  local_b90 = &local_90;
  local_b88 = size(in_stack_00000308);
  *local_b90 = local_b88;
  local_ba0 = &local_88;
  local_b98 = size(in_stack_00000310);
  *local_ba0 = local_b98;
  local_80 = ArrayPtr<const_char>::size(in_stack_00000318);
  local_78 = (_ *)&local_3b8;
  local_70 = 0x68;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x68;
  sVar1 = _::sum(local_78,nums);
  local_ab0->size_ = sVar1;
  pSVar2 = fwd<kj::StringTree>(params_local_1);
  local_730 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  local_728 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_720 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_718 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(local_60);
  local_710 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_708 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_700 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_6f8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_6f0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(params_8);
  local_6e8 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_9);
  local_6e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(params_10);
  local_6d8 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_11);
  local_6d0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_12);
  local_6c8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_13);
  local_6c0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_14);
  local_6b8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_15);
  local_6b0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_16);
  local_6a8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_6a0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(params_18);
  local_698 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_19);
  local_690 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(params_20);
  local_688 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_21);
  local_680 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_22);
  local_678 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_23);
  local_670 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_24);
  local_668 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_25);
  local_660 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_26);
  local_658 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_27);
  local_650 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_28);
  local_648 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_29);
  local_640 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_30);
  local_638 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_31);
  local_630 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_32);
  local_628 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(params_33);
  local_620 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_34);
  local_618 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_35);
  local_610 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_36);
  local_608 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(params_37);
  local_600 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_38);
  local_5f8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_39);
  local_5f0 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_40);
  local_5e8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_41);
  local_5e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_42);
  local_5d8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_43);
  local_5d0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_44);
  local_5c8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_45);
  local_5c0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_46);
  local_5b8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_47);
  local_5b0 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_48);
  local_5a8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(params_49);
  local_5a0 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_50);
  local_598 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_51);
  local_590 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_52);
  local_588 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(params_53);
  local_580 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_54);
  local_578 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_55);
  local_570 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_56);
  local_568 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_57);
  local_560 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_58);
  local_558 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_59);
  local_550 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_60);
  local_548 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_61);
  local_540 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_62);
  local_538 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_63);
  local_530 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_64);
  local_528 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_65);
  local_520 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(in_stack_000001f8);
  local_518 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  local_510 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000208);
  local_508 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000210);
  local_500 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000218);
  local_4f8 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000220);
  local_4f0 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  local_4e8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  local_4e0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000238);
  local_4d8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  local_4d0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000248);
  local_4c8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(in_stack_00000250);
  local_4c0 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000258);
  local_4b8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000260);
  local_4b0 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000268);
  local_4a8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(in_stack_00000270);
  local_4a0 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000278);
  local_498 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(in_stack_00000280);
  local_490 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000288);
  local_488 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000290);
  local_480 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000298);
  local_478 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002a0);
  local_470 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(in_stack_000002a8);
  local_468 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002b0);
  local_460 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002b8);
  local_458 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002c0);
  local_450 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002c8);
  local_448 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002d0);
  local_440 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002d8);
  local_438 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002e0);
  local_430 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(in_stack_000002e8);
  local_428 = flatSize(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002f0);
  local_420 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(in_stack_000002f8);
  local_418 = flatSize<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000300);
  local_410 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000308);
  local_408 = flatSize(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000310);
  local_400 = flatSize(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000318);
  local_3f8 = flatSize<kj::ArrayPtr<char_const>>(pAVar3);
  local_3f0 = (_ *)&local_730;
  local_3e8 = 0x68;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0x68;
  sVar1 = _::sum(local_3f0,nums_00);
  heapString(&local_3e0,sVar1);
  String::operator=(&local_ab0->text,&local_3e0);
  String::~String(&local_3e0);
  pSVar2 = fwd<kj::StringTree>(params_local_1);
  local_a98 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  local_a90 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_a88 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_a80 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(local_60);
  local_a78 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_4);
  local_a70 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_5);
  local_a68 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_a60 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_a58 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(params_8);
  local_a50 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_9);
  local_a48 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(params_10);
  local_a40 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_11);
  local_a38 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_12);
  local_a30 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_13);
  local_a28 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_14);
  local_a20 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_15);
  local_a18 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_16);
  local_a10 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_a08 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(params_18);
  local_a00 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_19);
  local_9f8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(params_20);
  local_9f0 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_21);
  local_9e8 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_22);
  local_9e0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_23);
  local_9d8 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_24);
  local_9d0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_25);
  local_9c8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_26);
  local_9c0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_27);
  local_9b8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_28);
  local_9b0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_29);
  local_9a8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_30);
  local_9a0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_31);
  local_998 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_32);
  local_990 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(params_33);
  local_988 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_34);
  local_980 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_35);
  local_978 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_36);
  local_970 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(params_37);
  local_968 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_38);
  local_960 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_39);
  local_958 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_40);
  local_950 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_41);
  local_948 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_42);
  local_940 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_43);
  local_938 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_44);
  local_930 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_45);
  local_928 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_46);
  local_920 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_47);
  local_918 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_48);
  local_910 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(params_49);
  local_908 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_50);
  local_900 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_51);
  local_8f8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_52);
  local_8f0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(params_53);
  local_8e8 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(params_54);
  local_8e0 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_55);
  local_8d8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_56);
  local_8d0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_57);
  local_8c8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_58);
  local_8c0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_59);
  local_8b8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_60);
  local_8b0 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_61);
  local_8a8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_62);
  local_8a0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_63);
  local_898 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(params_64);
  local_890 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_65);
  local_888 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(in_stack_000001f8);
  local_880 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  local_878 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000208);
  local_870 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000210);
  local_868 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000218);
  local_860 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000220);
  local_858 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  local_850 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  local_848 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000238);
  local_840 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  local_838 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000248);
  local_830 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(in_stack_00000250);
  local_828 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000258);
  local_820 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000260);
  local_818 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000268);
  local_810 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(in_stack_00000270);
  local_808 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000278);
  local_800 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(in_stack_00000280);
  local_7f8 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000288);
  local_7f0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000290);
  local_7e8 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000298);
  local_7e0 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002a0);
  local_7d8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(in_stack_000002a8);
  local_7d0 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002b0);
  local_7c8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002b8);
  local_7c0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002c0);
  local_7b8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002c8);
  local_7b0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002d0);
  local_7a8 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002d8);
  local_7a0 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002e0);
  local_798 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar5 = fwd<kj::String>(in_stack_000002e8);
  local_790 = branchCount(pSVar5);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002f0);
  local_788 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(in_stack_000002f8);
  local_780 = branchCount<kj::CappedArray<char,14ul>>(pCVar4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000300);
  local_778 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000308);
  local_770 = branchCount(pSVar2);
  pSVar2 = fwd<kj::StringTree>(in_stack_00000310);
  local_768 = branchCount(pSVar2);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000318);
  local_760 = branchCount<kj::ArrayPtr<char_const>>(pAVar3);
  local_758 = (_ *)&local_a98;
  local_750 = 0x68;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0x68;
  sVar1 = _::sum(local_758,nums_01);
  heapArray<kj::StringTree::Branch>(&local_748,sVar1);
  Array<kj::StringTree::Branch>::operator=(&local_ab0->branches,&local_748);
  Array<kj::StringTree::Branch>::~Array(&local_748);
  local_ba8 = String::begin(&local_ab0->text);
  local_bb0 = fwd<kj::StringTree>(params_local_1);
  local_e98 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_2);
  local_e90 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_ea0 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_ea8 = fwd<kj::ArrayPtr<char_const>>(local_60);
  local_eb0 = fwd<kj::ArrayPtr<char_const>>(params_4);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(params_5);
  pAVar6 = fwd<kj::ArrayPtr<char_const>>(params_6);
  pAVar7 = fwd<kj::ArrayPtr<char_const>>(params_7);
  pCVar4 = fwd<kj::CappedArray<char,14ul>>(params_8);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(params_9);
  local_eb8 = fwd<kj::StringTree>(params_10);
  local_ec0 = fwd<kj::ArrayPtr<char_const>>(params_11);
  local_bb8 = fwd<kj::ArrayPtr<char_const>>(params_12);
  local_bc0 = fwd<kj::ArrayPtr<char_const>>(params_13);
  local_bc8 = fwd<kj::ArrayPtr<char_const>>(params_14);
  local_bd0 = fwd<kj::ArrayPtr<char_const>>(params_15);
  local_bd8 = fwd<kj::ArrayPtr<char_const>>(params_16);
  local_be0 = fwd<kj::ArrayPtr<char_const>>(params_17);
  local_be8 = fwd<kj::CappedArray<char,14ul>>(params_18);
  local_bf0 = fwd<kj::ArrayPtr<char_const>>(params_19);
  local_bf8 = fwd<kj::StringTree>(params_20);
  local_c00 = fwd<kj::StringTree>(params_21);
  local_c08 = fwd<kj::ArrayPtr<char_const>>(params_22);
  local_c10 = fwd<kj::String>(params_23);
  local_c18 = fwd<kj::ArrayPtr<char_const>>(params_24);
  local_c20 = fwd<kj::ArrayPtr<char_const>>(params_25);
  local_c28 = fwd<kj::ArrayPtr<char_const>>(params_26);
  local_c30 = fwd<kj::ArrayPtr<char_const>>(params_27);
  local_c38 = fwd<kj::ArrayPtr<char_const>>(params_28);
  local_c40 = fwd<kj::ArrayPtr<char_const>>(params_29);
  local_c48 = fwd<kj::ArrayPtr<char_const>>(params_30);
  local_c50 = fwd<kj::String>(params_31);
  local_c58 = fwd<kj::ArrayPtr<char_const>>(params_32);
  local_c60 = fwd<kj::CappedArray<char,14ul>>(params_33);
  local_c68 = fwd<kj::ArrayPtr<char_const>>(params_34);
  local_c70 = fwd<kj::ArrayPtr<char_const>>(params_35);
  local_c78 = fwd<kj::ArrayPtr<char_const>>(params_36);
  local_c80 = fwd<kj::StringTree>(params_37);
  local_c88 = fwd<kj::ArrayPtr<char_const>>(params_38);
  local_c90 = fwd<kj::String>(params_39);
  local_c98 = fwd<kj::ArrayPtr<char_const>>(params_40);
  local_ca0 = fwd<kj::ArrayPtr<char_const>>(params_41);
  local_ca8 = fwd<kj::ArrayPtr<char_const>>(params_42);
  local_cb0 = fwd<kj::ArrayPtr<char_const>>(params_43);
  local_cb8 = fwd<kj::ArrayPtr<char_const>>(params_44);
  local_cc0 = fwd<kj::ArrayPtr<char_const>>(params_45);
  local_cc8 = fwd<kj::ArrayPtr<char_const>>(params_46);
  local_cd0 = fwd<kj::String>(params_47);
  local_cd8 = fwd<kj::ArrayPtr<char_const>>(params_48);
  local_ce0 = fwd<kj::CappedArray<char,14ul>>(params_49);
  local_ce8 = fwd<kj::ArrayPtr<char_const>>(params_50);
  local_cf0 = fwd<kj::ArrayPtr<char_const>>(params_51);
  local_cf8 = fwd<kj::ArrayPtr<char_const>>(params_52);
  local_d00 = fwd<kj::StringTree>(params_53);
  local_d08 = fwd<kj::StringTree>(params_54);
  local_d10 = fwd<kj::ArrayPtr<char_const>>(params_55);
  local_d18 = fwd<kj::ArrayPtr<char_const>>(params_56);
  local_d20 = fwd<kj::ArrayPtr<char_const>>(params_57);
  local_d28 = fwd<kj::ArrayPtr<char_const>>(params_58);
  local_d30 = fwd<kj::ArrayPtr<char_const>>(params_59);
  local_d38 = fwd<kj::String>(params_60);
  local_d40 = fwd<kj::ArrayPtr<char_const>>(params_61);
  local_d48 = fwd<kj::ArrayPtr<char_const>>(params_62);
  local_d50 = fwd<kj::ArrayPtr<char_const>>(params_63);
  local_d58 = fwd<kj::String>(params_64);
  local_d60 = fwd<kj::ArrayPtr<char_const>>(params_65);
  local_d68 = fwd<kj::CappedArray<char,14ul>>(in_stack_000001f8);
  local_d70 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  local_d78 = fwd<kj::StringTree>(in_stack_00000208);
  local_d80 = fwd<kj::StringTree>(in_stack_00000210);
  local_d88 = fwd<kj::StringTree>(in_stack_00000218);
  local_d90 = fwd<kj::StringTree>(in_stack_00000220);
  local_d98 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  local_da0 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  local_da8 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000238);
  local_db0 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  local_db8 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000248);
  local_dc0 = fwd<kj::String>(in_stack_00000250);
  local_dc8 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000258);
  local_dd0 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000260);
  local_dd8 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000268);
  local_de0 = fwd<kj::String>(in_stack_00000270);
  local_de8 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000278);
  local_df0 = fwd<kj::CappedArray<char,14ul>>(in_stack_00000280);
  local_df8 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000288);
  local_e00 = fwd<kj::StringTree>(in_stack_00000290);
  local_e08 = fwd<kj::StringTree>(in_stack_00000298);
  local_e10 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002a0);
  local_e18 = fwd<kj::String>(in_stack_000002a8);
  local_e20 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002b0);
  local_e28 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002b8);
  local_e30 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002c0);
  local_e38 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002c8);
  local_e40 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002d0);
  local_e48 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002d8);
  local_e50 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002e0);
  local_e58 = fwd<kj::String>(in_stack_000002e8);
  local_e60 = fwd<kj::ArrayPtr<char_const>>(in_stack_000002f0);
  local_e68 = fwd<kj::CappedArray<char,14ul>>(in_stack_000002f8);
  local_e70 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000300);
  local_e78 = fwd<kj::StringTree>(in_stack_00000308);
  local_e80 = fwd<kj::StringTree>(in_stack_00000310);
  local_ec8 = fwd<kj::ArrayPtr<char_const>>(in_stack_00000318);
  local_ed0 = local_e80;
  local_ed8 = local_e78;
  local_ee0 = local_e70;
  local_ee8 = local_e68;
  local_ef0 = local_e60;
  local_ef8 = local_e58;
  local_f00 = local_e50;
  local_f08 = local_e48;
  local_f10 = local_e40;
  local_f18 = local_e38;
  local_f20 = local_e30;
  local_f28 = local_e28;
  local_f30 = local_e20;
  local_f38 = local_e18;
  local_f40 = local_e10;
  local_f48 = local_e08;
  local_f50 = local_e00;
  local_f58 = local_df8;
  local_f60 = local_df0;
  local_f68 = local_de8;
  local_f70 = local_de0;
  local_f78 = local_dd8;
  local_f80 = local_dd0;
  local_f88 = local_dc8;
  local_f90 = local_dc0;
  local_f98 = local_db8;
  local_fa0 = local_db0;
  local_fa8 = local_da8;
  local_fb0 = local_da0;
  local_fb8 = local_d98;
  local_fc0 = local_d90;
  local_fc8 = local_d88;
  local_fd0 = local_d80;
  local_fd8 = local_d78;
  local_fe0 = local_d70;
  local_fe8 = local_d68;
  local_ff0 = local_d60;
  local_ff8 = local_d58;
  local_1000 = local_d50;
  local_1008 = local_d48;
  local_1010 = local_d40;
  local_1018 = local_d38;
  local_1020 = local_d30;
  local_1028 = local_d28;
  local_1030 = local_d20;
  local_1038 = local_d18;
  local_1040 = local_d10;
  local_1048 = local_d08;
  local_1050 = local_d00;
  local_1058 = local_cf8;
  local_1060 = local_cf0;
  local_1068 = local_ce8;
  local_1070 = local_ce0;
  local_1078 = local_cd8;
  local_1080 = local_cd0;
  local_1088 = local_cc8;
  local_1090 = local_cc0;
  local_1098 = local_cb8;
  local_10a0 = local_cb0;
  local_10a8 = local_ca8;
  local_10b0 = local_ca0;
  local_10b8 = local_c98;
  local_10c0 = local_c90;
  local_10c8 = local_c88;
  local_10d0 = local_c80;
  local_10d8 = local_c78;
  local_10e0 = local_c70;
  local_10e8 = local_c68;
  local_10f0 = local_c60;
  local_10f8 = local_c58;
  local_1100 = local_c50;
  local_1108 = local_c48;
  local_1110 = local_c40;
  local_1118 = local_c38;
  local_1120 = local_c30;
  local_1128 = local_c28;
  local_1130 = local_c20;
  local_1138 = local_c18;
  local_1140 = local_c10;
  local_1148 = local_c08;
  local_1150 = local_c00;
  local_1158 = local_bf8;
  local_1160 = local_bf0;
  local_1168 = local_be8;
  local_1170 = local_be0;
  local_1178 = local_bd8;
  local_1180 = local_bd0;
  local_1188 = local_bc8;
  local_1190 = local_bc0;
  local_1198 = local_bb8;
  local_11a0 = local_ec0;
  local_11a8 = local_eb8;
  local_11d8 = local_eb0;
  local_11e0 = local_ea8;
  local_11e8 = local_ea0;
  local_11d0 = pAVar3;
  local_11c8 = pAVar6;
  local_11c0 = pAVar7;
  local_11b8 = pCVar4;
  local_11b0 = pAVar8;
  local_e88 = (undefined1 *)&local_11e8;
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::Ar___pedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (local_ab0,local_ba8,0,local_bb0,local_e98,local_e90);
  return local_aa8;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}